

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

string * __thiscall
libcellml::Printer::PrinterImpl::printResetChild
          (string *__return_storage_ptr__,PrinterImpl *this,string *childLabel,string *childId,
          string *math,IdList *idList,bool autoIds)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (math->_M_string_length == 0 && childId->_M_string_length == 0) {
    return __return_storage_ptr__;
  }
  std::operator+(&local_d0,"<",childLabel);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_d0);
  if (childId->_M_string_length == 0) {
    if (!autoIds) goto LAB_00209926;
    makeUniqueId(&local_90,idList);
    std::operator+(&local_b0," id=\"",&local_90);
    std::operator+(&local_d0,&local_b0,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    this_00 = &local_90;
  }
  else {
    std::operator+(&local_b0," id=\"",childId);
    std::operator+(&local_d0,&local_b0,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    this_00 = &local_b0;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00209926:
  if (math->_M_string_length == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    printMath(&local_70,this,math);
    std::operator+(&local_50,">",&local_70);
    std::operator+(&local_90,&local_50,"</");
    std::operator+(&local_b0,&local_90,childLabel);
    std::operator+(&local_d0,&local_b0,">");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Printer::PrinterImpl::printResetChild(const std::string &childLabel, const std::string &childId,
                                                  const std::string &math, IdList &idList, bool autoIds)
{
    std::string repr;

    if (!childId.empty() || !math.empty()) {
        repr += "<" + childLabel;
        if (!childId.empty()) {
            repr += " id=\"" + childId + "\"";
        } else if (autoIds) {
            repr += " id=\"" + makeUniqueId(idList) + "\"";
        }
        if (math.empty()) {
            repr += "/>";
        } else {
            repr += ">" + printMath(math) + "</" + childLabel + ">";
        }
    }

    return repr;
}